

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  undefined8 this_00;
  bool bVar1;
  TargetType TVar2;
  reference pbVar3;
  char *tgt;
  GeneratorExpressionContent *content_00;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  __type local_293;
  __type local_291;
  __type local_281;
  undefined1 local_230 [8];
  string result;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  byte local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  cmGeneratorTarget *local_c0;
  cmGeneratorTarget *target;
  string local_b0;
  string local_90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 local_58 [8];
  string name;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *this_local;
  
  content_00 = content;
  name.field_2._8_8_ = dagChecker;
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(parameters);
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_60);
  std::__cxx11::string::string((string *)local_58,(string *)pbVar3);
  bVar1 = cmGeneratorExpression::IsValidTargetName((string *)local_58);
  if (bVar1) {
    local_c0 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,(string *)local_58);
    if (local_c0 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_e0,content);
      std::operator+(&local_120,"No target \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(&local_100,&local_120,"\"");
      reportError(context,&local_e0,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      target._0_4_ = 1;
    }
    else {
      TVar2 = cmGeneratorTarget::GetType(local_c0);
      if (((int)TVar2 < 4) ||
         (TVar2 = cmGeneratorTarget::GetType(local_c0), TVar2 == UNKNOWN_LIBRARY)) {
        this_00 = name.field_2._8_8_;
        local_1a1 = 0;
        local_281 = false;
        if (name.field_2._8_8_ != 0) {
          tgt = (char *)std::__cxx11::string::c_str();
          bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                            ((cmGeneratorExpressionDAGChecker *)this_00,tgt);
          local_291 = true;
          if (!bVar1) {
            bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources
                              ((cmGeneratorExpressionDAGChecker *)name.field_2._8_8_);
            local_293 = false;
            if (bVar1) {
              cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_
                        (&local_1a0,(cmGeneratorExpressionDAGChecker *)name.field_2._8_8_);
              local_1a1 = 1;
              local_293 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_58,&local_1a0);
            }
            local_291 = local_293;
          }
          local_281 = local_291;
        }
        if ((local_1a1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        if (local_281 == false) {
          std::
          set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
          ::insert(&context->DependTargets,&local_c0);
          pVar4 = std::
                  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::insert(&context->AllTargets,&local_c0);
          result.field_2._8_8_ = pVar4.first._M_node;
          TargetFilesystemArtifactResultCreator<ArtifactBundleDirTag>::Create_abi_cxx11_
                    ((string *)local_230,
                     (TargetFilesystemArtifactResultCreator<ArtifactBundleDirTag> *)local_c0,
                     (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,content_00
                    );
          if ((context->HadError & 1U) == 0) {
            TargetFilesystemArtifactResultGetter<ArtifactPathTag>::Get
                      (__return_storage_ptr__,(string *)local_230);
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__);
          }
          target._0_4_ = 1;
          std::__cxx11::string::~string((string *)local_230);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1c8,content);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1e8,
                     "Expressions which require the linker language may not be used while evaluating link libraries"
                     ,&local_1e9);
          reportError(context,&local_1c8,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          target._0_4_ = 1;
        }
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_140,content);
        std::operator+(&local_180,"Target \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        std::operator+(&local_160,&local_180,"\" is not an executable or library.");
        reportError(context,&local_140,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        target._0_4_ = 1;
      }
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_90,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b0,"Expression syntax not recognized.",
               (allocator *)((long)&target + 7));
    reportError(context,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    target._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* dagChecker) const
    CM_OVERRIDE
  {
    // Lookup the referenced target.
    std::string name = *parameters.begin();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(), "Target \"" +
                      name + "\" is not an executable or library.");
      return std::string();
    }
    if (dagChecker && (dagChecker->EvaluatingLinkLibraries(name.c_str()) ||
                       (dagChecker->EvaluatingSources() &&
                        name == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }